

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

void UpdateThumbVFPPredicate(cs_struct *ud,MCInst *MI)

{
  byte bVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  MCOperand *pMVar5;
  MCInst *in_RSI;
  long in_RDI;
  uint i;
  MCOperandInfo *OpInfo;
  unsigned_short NumOps;
  uint CC;
  uint local_24;
  ARM_ITStatus *in_stack_ffffffffffffffe0;
  MCOperandInfo *pMVar6;
  
  uVar3 = ITStatus_getITCC(in_stack_ffffffffffffffe0);
  _Var2 = ITStatus_instrInITBlock((ARM_ITStatus *)(in_RDI + 0x54));
  if (_Var2) {
    ITStatus_advanceITState((ARM_ITStatus *)(in_RDI + 0x54));
  }
  uVar4 = MCInst_getOpcode(in_RSI);
  pMVar6 = ARMInsts[uVar4].OpInfo;
  uVar4 = MCInst_getOpcode(in_RSI);
  bVar1 = ARMInsts[uVar4].NumOperands;
  local_24 = 0;
  while( true ) {
    if (bVar1 <= local_24) {
      return;
    }
    _Var2 = MCOperandInfo_isPredicate(pMVar6 + local_24);
    if (_Var2) break;
    local_24 = local_24 + 1;
  }
  pMVar5 = MCInst_getOperand(in_RSI,local_24);
  MCOperand_setImm(pMVar5,(ulong)uVar3);
  if (uVar3 == 0xe) {
    pMVar5 = MCInst_getOperand(in_RSI,local_24 + 1);
    MCOperand_setReg(pMVar5,0);
    return;
  }
  pMVar5 = MCInst_getOperand(in_RSI,local_24 + 1);
  MCOperand_setReg(pMVar5,3);
  return;
}

Assistant:

static void UpdateThumbVFPPredicate(cs_struct *ud, MCInst *MI)
{
	unsigned CC;
	unsigned short NumOps;
	const MCOperandInfo *OpInfo;
	unsigned i;

	CC = ITStatus_getITCC(&(ud->ITBlock));
	if (ITStatus_instrInITBlock(&(ud->ITBlock)))
		ITStatus_advanceITState(&(ud->ITBlock));

	OpInfo = ARMInsts[MCInst_getOpcode(MI)].OpInfo;
	NumOps = ARMInsts[MCInst_getOpcode(MI)].NumOperands;

	for (i = 0; i < NumOps; ++i) {
		if (MCOperandInfo_isPredicate(&OpInfo[i])) {
			MCOperand_setImm(MCInst_getOperand(MI, i), CC);
			if (CC == ARMCC_AL)
				MCOperand_setReg(MCInst_getOperand(MI, i+1), 0);
			else
				MCOperand_setReg(MCInst_getOperand(MI, i+1), ARM_CPSR);
			return;
		}
	}
}